

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texel_fetch_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  RenderContext *pRVar4;
  char *__s;
  DataType dataType;
  DataType pDataType;
  DataType sampleDataType;
  undefined1 *in_stack_fffffffffffff4d8;
  bool local_781;
  string local_780;
  undefined1 local_760 [8];
  string shaderSource_26;
  undefined1 local_720 [8];
  string shaderSource_25;
  undefined1 local_6e0 [8];
  string shaderSource_24;
  undefined1 local_6a0 [8];
  string shaderSource_23;
  undefined1 local_660 [8];
  string shaderSource_22;
  undefined1 local_620 [8];
  string shaderSource_21;
  undefined1 local_5e0 [8];
  string shaderSource_20;
  undefined1 local_5a0 [8];
  string shaderSource_19;
  undefined1 local_560 [8];
  string shaderSource_18;
  undefined1 local_520 [8];
  string shaderSource_17;
  undefined1 local_4e0 [8];
  string shaderSource_16;
  undefined1 local_4a0 [8];
  string shaderSource_15;
  undefined1 local_460 [8];
  string shaderSource_14;
  undefined1 local_420 [8];
  string shaderSource_13;
  undefined1 local_3e0 [8];
  string shaderSource_12;
  undefined1 local_3a0 [8];
  string shaderSource_11;
  undefined1 local_360 [8];
  string shaderSource_10;
  undefined1 local_320 [8];
  string shaderSource_9;
  undefined1 local_2e0 [8];
  string shaderSource_8;
  undefined1 local_2a0 [8];
  string shaderSource_7;
  undefined1 local_260 [8];
  string shaderSource_6;
  undefined1 local_220 [8];
  string shaderSource_5;
  undefined1 local_1e0 [8];
  string shaderSource_4;
  undefined1 local_1a0 [8];
  string shaderSource_3;
  undefined1 local_160 [8];
  string shaderSource_2;
  undefined1 local_120 [8];
  string shaderSource_1;
  undefined1 local_e0 [8];
  string shaderSource;
  int dataTypeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  allocator<char> local_71;
  int shaderNdx;
  byte local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  pRVar4 = NegativeTestContext::getRenderContext(ctx);
  local_14.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_18 = (deUint32)glu::ApiType::es(3,2);
  bVar3 = glu::contextSupports(local_14,(ApiType)local_18);
  pNVar2 = local_10;
  local_39 = 0;
  local_781 = true;
  if (!bVar3) {
    NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)0x2d,dataType);
    local_39 = 1;
    local_781 = NegativeTestContext::isExtensionSupported(pNVar2,&local_38);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  pNVar2 = local_10;
  if (local_781 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shaderNdx,"texelFetch: Invalid P type.",&local_71);
    NegativeTestContext::beginSection(pNVar2,(string *)&shaderNdx);
    std::__cxx11::string::~string((string *)&shaderNdx);
    std::allocator<char>::~allocator(&local_71);
    for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
      bVar3 = NegativeTestContext::isShaderSupported
                        (local_10,*(ShaderType *)
                                   (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                   (long)local_78 * 4));
      pNVar2 = local_10;
      if (bVar3) {
        __s = glu::getShaderTypeName
                        (*(ShaderType *)
                          (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4
                          ));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dataTypeNdx,__s,
                   (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
        std::operator+(&local_98,"Verify shader: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dataTypeNdx);
        NegativeTestContext::beginSection(pNVar2,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&dataTypeNdx);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
        for (shaderSource.field_2._8_4_ = 0; sampleDataType = (DataType)in_stack_fffffffffffff4d8,
            (int)shaderSource.field_2._8_4_ < 4;
            shaderSource.field_2._8_4_ = shaderSource.field_2._8_4_ + 1) {
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x42,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_e0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_120,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x43,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_120);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_120);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_160,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x44,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_160);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_160);
          if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_intTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 0x1c) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_1a0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x42,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_4.field_2._M_local_buf + 8),(string *)local_1a0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_4.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_4.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1a0);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_1e0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x43,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_5.field_2._M_local_buf + 8),(string *)local_1e0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_5.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_5.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_1e0);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_220,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x44,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_6.field_2._M_local_buf + 8),(string *)local_220);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_6.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_6.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_220);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_260,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x42,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_7.field_2._M_local_buf + 8),(string *)local_260);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_7.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_7.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_260);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_2a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x43,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_8.field_2._M_local_buf + 8),(string *)local_2a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_8.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_8.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_2a0);
          pDataType = TYPE_INT;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_2e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x44,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_9.field_2._M_local_buf + 8),(string *)local_2e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_9.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_9.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_2e0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_320,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x55,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_10.field_2._M_local_buf + 8),(string *)local_320);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_10.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_10.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_320);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_360,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x56,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_11.field_2._M_local_buf + 8),(string *)local_360);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_11.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_11.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_360);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_3a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x57,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_12.field_2._M_local_buf + 8),(string *)local_3a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_12.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_12.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_3a0);
          if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_intTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 0x1b) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_3e0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x55,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_13.field_2._M_local_buf + 8),(string *)local_3e0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_13.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_13.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_3e0);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_420,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x56,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_14.field_2._M_local_buf + 8),(string *)local_420);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_14.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_14.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_420);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_460,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x57,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_15.field_2._M_local_buf + 8),(string *)local_460);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_15.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_15.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_460);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_4a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x55,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_16.field_2._M_local_buf + 8),(string *)local_4a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_16.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_16.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_4a0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_4e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x56,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_17.field_2._M_local_buf + 8),(string *)local_4e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_17.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_17.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_4e0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_520,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x57,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),pDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_18.field_2._M_local_buf + 8),(string *)local_520);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_18.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_18.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_520);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_560,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x58,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_19.field_2._M_local_buf + 8),(string *)local_560);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_19.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_19.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_560);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_5a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x59,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_20.field_2._M_local_buf + 8),(string *)local_5a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_20.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_20.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_5a0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_5e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x5a,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_floatTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_21.field_2._M_local_buf + 8),(string *)local_5e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_21.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_21.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_5e0);
          if (*(int *)(NegativeTestShared::(anonymous_namespace)::s_intTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4) != 0x1d) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_620,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x58,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_22.field_2._M_local_buf + 8),(string *)local_620);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_22.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_22.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_620);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_660,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x59,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_23.field_2._M_local_buf + 8),(string *)local_660);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_23.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_23.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_660);
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      ((string *)local_6a0,(_anonymous_namespace_ *)local_10,
                       (NegativeTestContext *)
                       (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                       (long)local_78 * 4),0x5a,
                       *(DataType *)
                        (NegativeTestShared::(anonymous_namespace)::s_intTypes +
                        (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
            pNVar2 = local_10;
            SVar1 = *(ShaderType *)
                     (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
            std::__cxx11::string::string
                      ((string *)(shaderSource_24.field_2._M_local_buf + 8),(string *)local_6a0);
            verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_24.field_2 + 8));
            std::__cxx11::string::~string((string *)(shaderSource_24.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)local_6a0);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_6e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x58,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_25.field_2._M_local_buf + 8),(string *)local_6e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_25.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_25.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_6e0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_720,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x59,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,sampleDataType);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_26.field_2._M_local_buf + 8),(string *)local_720);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_26.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_26.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_720);
          in_stack_fffffffffffff4d8 = NegativeTestShared::(anonymous_namespace)::s_shaders;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    ((string *)local_760,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x5a,
                     *(DataType *)
                      (NegativeTestShared::(anonymous_namespace)::s_uintTypes +
                      (long)(int)shaderSource.field_2._8_4_ * 4),TYPE_INT,0x2c34be0);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)(in_stack_fffffffffffff4d8 + (long)local_78 * 4);
          std::__cxx11::string::string((string *)&local_780,(string *)local_760);
          verifyShader(pNVar2,SVar1,&local_780);
          std::__cxx11::string::~string((string *)&local_780);
          std::__cxx11::string::~string((string *)local_760);
        }
        NegativeTestContext::endSection(local_10);
      }
    }
    NegativeTestContext::endSection(local_10);
  }
  return;
}

Assistant:

void texel_fetch_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("texelFetch: Invalid P type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC2)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_BUFFER
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}

					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_BUFFER, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT_VEC3)
					{
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_INT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_INT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}